

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

bool google::protobuf::compiler::ruby::UsesTypeFromFile
               (Descriptor *message,FileDescriptor *file,string *error)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  Descriptor *pDVar4;
  EnumDescriptor *pEVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  FieldDescriptor *this;
  long lVar9;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (0 < *(int *)(message + 0x2c)) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      lVar1 = *(long *)(message + 0x30);
      this = (FieldDescriptor *)(lVar1 + lVar9);
      TVar3 = FieldDescriptor::type(this);
      if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) &&
          (pDVar4 = FieldDescriptor::message_type(this), *(FileDescriptor **)(pDVar4 + 0x10) == file
          )) || ((TVar3 = FieldDescriptor::type(this), TVar3 == TYPE_ENUM &&
                 (pEVar5 = FieldDescriptor::enum_type(this),
                 *(FileDescriptor **)(pEVar5 + 0x10) == file)))) {
        std::operator+(&local_70,"proto3 message field ",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + 8 + lVar9));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_e0 = *plVar7;
          lStack_d8 = plVar6[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar7;
          local_f0 = (long *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,**(ulong **)file);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_c0 = *plVar7;
          lStack_b8 = plVar6[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar7;
          local_d0 = (long *)*plVar6;
        }
        local_c8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_a0 = *plVar7;
          lStack_98 = plVar6[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar7;
          local_b0 = (long *)*plVar6;
        }
        local_a8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,**(ulong **)file);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar6[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar6;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_40 = *plVar7;
          lStack_38 = plVar6[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar7;
          local_50 = (long *)*plVar6;
        }
        local_48 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)error,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        return true;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0xa8;
    } while (lVar8 < *(int *)(message + 0x2c));
  }
  if (*(int *)(message + 0x48) < 1) {
    bVar2 = false;
  }
  else {
    lVar8 = 0;
    lVar9 = 0;
    do {
      bVar2 = UsesTypeFromFile((Descriptor *)(*(long *)(message + 0x50) + lVar8),file,error);
      if (bVar2) {
        return bVar2;
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar9 < *(int *)(message + 0x48));
  }
  return bVar2;
}

Assistant:

bool UsesTypeFromFile(const Descriptor* message, const FileDescriptor* file,
                      string* error) {
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if ((field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
         field->message_type()->file() == file) ||
        (field->type() == FieldDescriptor::TYPE_ENUM &&
         field->enum_type()->file() == file)) {
      *error = "proto3 message field " + field->full_name() + " in file " +
               file->name() + " has a dependency on a type from proto2 file " +
               file->name() +
               ".  Ruby doesn't support proto2 yet, so we must fail.";
      return true;
    }
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (UsesTypeFromFile(message->nested_type(i), file, error)) {
      return true;
    }
  }

  return false;
}